

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O3

void CPU::WDC65816::ProcessorStorageConstructor::direct_indirect_indexed
               (AccessType type,bool is8bit,function<void_(CPU::WDC65816::MicroOp)> *target)

{
  MicroOp local_22 [10];
  
  local_22[0] = CycleFetchIncrementPC;
  if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*target->_M_invoker)((_Any_data *)target,local_22);
    local_22[1] = 0x23;
    if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
      (*target->_M_invoker)((_Any_data *)target,local_22 + 1);
      local_22[2] = 3;
      if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
        (*target->_M_invoker)((_Any_data *)target,local_22 + 2);
        local_22[3] = 7;
        if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
          (*target->_M_invoker)((_Any_data *)target,local_22 + 3);
          local_22[4] = 6;
          if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
            (*target->_M_invoker)((_Any_data *)target,local_22 + 4);
            local_22[5] = 0x32;
            if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
              (*target->_M_invoker)((_Any_data *)target,local_22 + 5);
              if (type == Read) {
                local_22[6] = 0x22;
                if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
                  (*target->_M_invoker)((_Any_data *)target,local_22 + 6);
                  local_22[7] = 8;
                  if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
                    (*target->_M_invoker)((_Any_data *)target,local_22 + 7);
                    type = Read;
                    goto LAB_003e3176;
                  }
                }
              }
              else {
                local_22[8] = 0x21;
                if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
                  (*target->_M_invoker)((_Any_data *)target,local_22 + 8);
                  local_22[9] = 8;
                  if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
                    (*target->_M_invoker)((_Any_data *)target,local_22 + 9);
LAB_003e3176:
                    read_write(type,is8bit,target);
                    return;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  std::__throw_bad_function_call();
}

Assistant:

static void direct_indirect_indexed(AccessType type, bool is8bit, const std::function<void(MicroOp)> &target) {
		target(CycleFetchIncrementPC);					// DO.

		target(OperationConstructDirect);
		target(CycleFetchPreviousPCThrowaway);			// IO.

		target(CycleFetchIncrementData);				// AAL.
		target(CycleFetchData);							// AAH.

		target(OperationCopyDataToInstruction);
		if(type == AccessType::Read) {
			target(OperationConstructAbsoluteYRead);	// Calculate data address, potentially skipping the next fetch.
		} else {
			target(OperationConstructAbsoluteY);		// Calculate data address.
		}
		target(CycleFetchIncorrectDataAddress);			// IO.

		read_write(type, is8bit, target);
	}